

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O3

Aig_Man_t * Aig_ManReduceLaches(Aig_Man_t *p,int fVerbose)

{
  int iVar1;
  Vec_Ptr_t *vMap;
  Aig_Man_t *p_00;
  
  if (fVerbose != 0) {
    puts("Performing combinational register sweep:");
  }
  do {
    iVar1 = Aig_ManReduceLachesCount(p);
    if (iVar1 == 0) {
      return p;
    }
    vMap = Aig_ManReduceLachesOnce(p);
    p_00 = Aig_ManRemap(p,vMap);
    if (vMap->pArray != (void **)0x0) {
      free(vMap->pArray);
    }
    free(vMap);
    Aig_ManSeqCleanup(p_00);
    if (fVerbose != 0) {
      Aig_ManReportImprovement(p,p_00);
    }
    Aig_ManStop(p);
    p = p_00;
  } while (p_00->nRegs != 0);
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManReduceLaches( Aig_Man_t * p, int fVerbose )
{
    Aig_Man_t * pTemp;
    Vec_Ptr_t * vMap;
    int nSaved, nCur;
    if ( fVerbose )
        printf( "Performing combinational register sweep:\n" );
    for ( nSaved = 0; (nCur = Aig_ManReduceLachesCount(p)); nSaved += nCur )
    {
//        printf( "Reducible = %d\n", nCur );
        vMap = Aig_ManReduceLachesOnce( p );
        p = Aig_ManRemap( pTemp = p, vMap );
        Vec_PtrFree( vMap );
        Aig_ManSeqCleanup( p );
        if ( fVerbose )
            Aig_ManReportImprovement( pTemp, p );
        Aig_ManStop( pTemp );
        if ( p->nRegs == 0 )
            break;
    }
    return p;
}